

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O0

void wasm::hash_combine(size_t *digest,size_t otherDigest)

{
  size_t otherDigest_local;
  size_t *digest_local;
  
  *digest = otherDigest + 0x9e3779b97f4a7c15 + *digest * 0x1000 + (*digest >> 4) ^ *digest;
  return;
}

Assistant:

inline void hash_combine(std::size_t& digest, const std::size_t otherDigest) {
  // see: boost/container_hash/hash.hpp
  // The constant is the N-bits reciprocal of the golden ratio:
  //  phi = (1 + sqrt(5)) / 2
#if SIZE_MAX == UINT64_MAX
  //  trunc(2^64 / phi) = 0x9e3779b97f4a7c15
  digest ^= otherDigest + 0x9e3779b97f4a7c15 + (digest << 12) + (digest >> 4);
#else
  //  trunc(2^32 / phi) = 0x9e3779b9
  digest ^= otherDigest + 0x9e3779b9 + (digest << 6) + (digest >> 2);
#endif
}